

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

optional<double> assign_d(string_view value,double mindef,double maxdef)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  optional<double> oVar6;
  
  oVar6 = to_double(value);
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_8_ = oVar6.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
  uVar1 = vcmppd_avx512vl(ZEXT816(0) << 0x40,auVar3,2);
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = mindef;
  auVar4._8_8_ = extraout_XMM0_Qb;
  auVar4._0_8_ = oVar6.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
  uVar2 = vcmppd_avx512vl(auVar4,auVar5,2);
  oVar6.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _8_8_ = CONCAT71(oVar6.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._9_7_,
                   oVar6.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged & (byte)uVar1 & 3 & (byte)uVar2)
          & 0xffffffffffffff01;
  return (optional<double>)
         oVar6.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

constexpr static std::optional<double>
assign_d(std::string_view value, double mindef, double maxdef)
{
    auto result = ::to_double(value);

    if (result.has_value() && *result >= mindef && *result <= maxdef)
        return *result;
    else
        return std::nullopt;
}